

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O3

void __thiscall
Memory::SmallHeapBlockT<SmallAllocationBlockAttributes>::VerifyMark
          (SmallHeapBlockT<SmallAllocationBlockAttributes> *this)

{
  HeapBlockType HVar1;
  ushort uVar2;
  undefined4 *puVar3;
  SmallHeapBlockBitVector *iterStart;
  Recycler *this_00;
  code *pcVar4;
  bool bVar5;
  BOOLEAN BVar6;
  ushort uVar7;
  BVIndex i;
  SmallHeapBlockBitVector *this_01;
  byte *pbVar8;
  char *objectAddress;
  uint uVar9;
  undefined8 *in_FS_OFFSET;
  undefined1 local_98 [8];
  FBVEnumerator _bvenum;
  SmallHeapBlockBitVector tempFreeBits;
  
  if ((this->super_HeapBlock).needOOMRescan == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)*in_FS_OFFSET;
    *puVar3 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x3e4,"(!this->needOOMRescan)","!this->needOOMRescan");
    if (!bVar5) {
LAB_00209e11:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar3 = 0;
  }
  iterStart = this->markBits;
  _bvenum.curUnit.word = 0;
  BuildFreeBitVector(this,(SmallHeapBlockBitVector *)&_bvenum.curUnit);
  this_01 = GetInvalidBitVector(this);
  uVar2 = this->objectSize;
  this_00 = this->heapBucket->heapInfo->recycler;
  JsUtil::FBVEnumerator::FBVEnumerator((FBVEnumerator *)local_98,iterStart->data,iterStart[1].data);
  bVar5 = JsUtil::FBVEnumerator::End((FBVEnumerator *)local_98);
  if (!bVar5) {
    puVar3 = (undefined4 *)*in_FS_OFFSET;
    do {
      i = JsUtil::FBVEnumerator::GetCurrent((FBVEnumerator *)local_98);
      BVar6 = BVStatic<256UL>::Test((BVStatic<256UL> *)&_bvenum.curUnit,i);
      if ((BVar6 != '\0') || (BVar6 = BVStatic<256UL>::Test(this_01,i), BVar6 != '\0'))
      goto LAB_00209bd7;
      bVar5 = IsValidBitIndex(this,i);
      if (!bVar5) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar3 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                           ,0x3f2,"(IsValidBitIndex(bitIndex))","IsValidBitIndex(bitIndex)");
        if (!bVar5) goto LAB_00209e11;
        *puVar3 = 0;
      }
      if ((i & 0xff00) != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar3 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.inl"
                           ,0x25d,"(bitIndex <= TBlockAttributes::MaxAddressBit)",
                           "bitIndex <= TBlockAttributes::MaxAddressBit");
        if (!bVar5) goto LAB_00209e11;
        *puVar3 = 0;
      }
      uVar7 = ValidPointers<SmallAllocationBlockAttributes>::GetAddressIndex
                        (&this->validPointers,i & 0xffff);
      if (0x100 < (ushort)(uVar7 + 1)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar3 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.inl"
                           ,0x261,
                           "(objectIndex == SmallHeapBlockT<TBlockAttributes>::InvalidAddressBit || objectIndex <= TBlockAttributes::MaxAddressBit)"
                           ,
                           "objectIndex == SmallHeapBlockT<TBlockAttributes>::InvalidAddressBit || objectIndex <= TBlockAttributes::MaxAddressBit"
                          );
        if (!bVar5) goto LAB_00209e11;
        *puVar3 = 0;
      }
      pbVar8 = ObjectInfo(this,(uint)uVar7);
      if ((*pbVar8 & 4) != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar3 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                           ,0x3f5,"((this->ObjectInfo(objectIndex) & NewTrackBit) == 0)",
                           "(this->ObjectInfo(objectIndex) & NewTrackBit) == 0");
        if (!bVar5) goto LAB_00209e11;
        *puVar3 = 0;
      }
      HVar1 = (this->super_HeapBlock).heapBlockType;
      if (HVar1 < 0xb) {
        if ((0x630U >> (HVar1 & 0x1f) & 1) == 0) {
          if ((0x84U >> (HVar1 & 0x1f) & 1) == 0) goto LAB_00209d7c;
        }
        else if (Js::Configuration::Global[0x2c156] == '\x01') goto LAB_00209d7c;
      }
      else {
LAB_00209d7c:
        pbVar8 = ObjectInfo(this,(uint)uVar7);
        if ((*pbVar8 & 0x20) == 0 && 7 < uVar2) {
          objectAddress = (this->super_HeapBlock).address + (uint)this->objectSize * (uint)uVar7;
          uVar9 = (uint)(uVar2 >> 3);
          do {
            bVar5 = Recycler::VerifyMark(this_00,objectAddress,*(void **)objectAddress);
            if (((bVar5) && (Js::Configuration::Global[0x2c156] == '\x01')) &&
               (Js::Configuration::Global[0x2c157] == '\x01')) {
              (*(this->super_HeapBlock)._vptr_HeapBlock[3])(this);
            }
            objectAddress = objectAddress + 8;
            uVar9 = uVar9 - 1;
          } while (uVar9 != 0);
        }
      }
LAB_00209bd7:
      JsUtil::FBVEnumerator::operator++((FBVEnumerator *)local_98,0);
      bVar5 = JsUtil::FBVEnumerator::End((FBVEnumerator *)local_98);
    } while (!bVar5);
  }
  return;
}

Assistant:

void
SmallHeapBlockT<TBlockAttributes>::VerifyMark()
{
    Assert(!this->needOOMRescan);

    SmallHeapBlockBitVector * marked = this->GetMarkedBitVector();
    SmallHeapBlockBitVector tempFreeBits;
    this->BuildFreeBitVector(&tempFreeBits);
    SmallHeapBlockBitVector * free = &tempFreeBits;
    SmallHeapBlockBitVector const * invalid = this->GetInvalidBitVector();
    uint objectWordCount = this->GetObjectWordCount();
    Recycler * recycler = this->heapBucket->heapInfo->recycler;

    FOREACH_BITSET_IN_FIXEDBV(bitIndex, marked)
    {
        if (!free->Test(bitIndex) && !invalid->Test(bitIndex))
        {
            Assert(IsValidBitIndex(bitIndex));
            uint objectIndex = GetObjectIndexFromBitIndex((ushort)bitIndex);

            Assert((this->ObjectInfo(objectIndex) & NewTrackBit) == 0);

            // NOTE: We can't verify mark for software write barrier blocks, because they may have
            // non-pointer updates that don't trigger the write barrier, but still look like a false reference.
            // Thus, when we get here, we'll see a false reference that isn't marked.
            // Since this situation is hard to detect, just don't verify mark for write barrier blocks.
            // We could fix this if we had object layout info.

            if (!this->IsLeafBlock()
#ifdef RECYCLER_WRITE_BARRIER
                && (!this->IsWithBarrier() || CONFIG_FLAG(ForceSoftwareWriteBarrier))
#endif
                )
            {
                if ((ObjectInfo(objectIndex) & LeafBit) == 0)
                {
                    char * objectAddress = this->address + objectIndex * objectSize;
                    for (uint i = 0; i < objectWordCount; i++)
                    {
                        void* target = *(void**) objectAddress;
                        if (recycler->VerifyMark(objectAddress, target))
                        {
#if DBG && GLOBAL_ENABLE_WRITE_BARRIER
                            if (CONFIG_FLAG(ForceSoftwareWriteBarrier) && CONFIG_FLAG(VerifyBarrierBit))
                            {
                                this->WBVerifyBitIsSet(objectAddress);
                            }
#endif
                        }

                        objectAddress += sizeof(void *);
                    }
                }
            }
        }
    }
    NEXT_BITSET_IN_FIXEDBV;
}